

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refl_coef_to_lpc.c
# Opt level: O0

void WebRtcSpl_ReflCoefToLpc(int16_t *k,int use_order,int16_t *a)

{
  int local_70;
  int local_6c;
  int i;
  int m;
  int16_t *kptr;
  int16_t *anyptr;
  int16_t *aptr2;
  int16_t *aptr;
  int16_t any [15];
  int16_t *a_local;
  int use_order_local;
  int16_t *k_local;
  
  *a = 0x1000;
  a[1] = *k >> 3;
  _i = k;
  for (local_6c = 1; local_6c < use_order; local_6c = local_6c + 1) {
    _i = _i + 1;
    aptr2 = a + 1;
    anyptr = a + local_6c;
    kptr = (int16_t *)((long)&aptr + 2);
    any[(long)(local_6c + 1) + -4] = *_i >> 3;
    for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
      *kptr = *aptr2 + (short)((int)*anyptr * (int)*_i >> 0xf);
      kptr = kptr + 1;
      aptr2 = aptr2 + 1;
      anyptr = anyptr + -1;
    }
    kptr = (int16_t *)&aptr;
    aptr2 = a;
    for (local_70 = 0; local_70 < local_6c + 2; local_70 = local_70 + 1) {
      *aptr2 = *kptr;
      aptr2 = aptr2 + 1;
      kptr = kptr + 1;
    }
  }
  return;
}

Assistant:

void WebRtcSpl_ReflCoefToLpc(const int16_t *k, int use_order, int16_t *a)
{
    int16_t any[WEBRTC_SPL_MAX_LPC_ORDER + 1];
    int16_t *aptr, *aptr2, *anyptr;
    const int16_t *kptr;
    int m, i;

    kptr = k;
    *a = 4096; // i.e., (Word16_MAX >> 3)+1.
    *any = *a;
    a[1] = *k >> 3;

    for (m = 1; m < use_order; m++)
    {
        kptr++;
        aptr = a;
        aptr++;
        aptr2 = &a[m];
        anyptr = any;
        anyptr++;

        any[m + 1] = *kptr >> 3;
        for (i = 0; i < m; i++)
        {
            *anyptr = *aptr + (int16_t)((*aptr2 * *kptr) >> 15);
            anyptr++;
            aptr++;
            aptr2--;
        }

        aptr = a;
        anyptr = any;
        for (i = 0; i < (m + 2); i++)
        {
            *aptr = *anyptr;
            aptr++;
            anyptr++;
        }
    }
}